

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O2

LPRowSetBase<double> * __thiscall
soplex::LPRowSetBase<double>::operator=(LPRowSetBase<double> *this,LPRowSetBase<double> *rs)

{
  if (this != rs) {
    SVSetBase<double>::operator=(&this->super_SVSetBase<double>,&rs->super_SVSetBase<double>);
    VectorBase<double>::operator=(&this->left,&rs->left);
    VectorBase<double>::operator=(&this->right,&rs->right);
    VectorBase<double>::operator=(&this->object,&rs->object);
    DataArray<int>::operator=(&this->scaleExp,&rs->scaleExp);
  }
  return this;
}

Assistant:

LPRowSetBase<R>& operator=(const LPRowSetBase<R>& rs)
   {
      if(this != &rs)
      {
         SVSetBase<R>::operator=(rs);
         left = rs.left;
         right = rs.right;
         object = rs.object;
         scaleExp = rs.scaleExp;

         assert(isConsistent());
      }

      return *this;
   }